

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkcell.c
# Opt level: O3

LispPTR N_OP_createcell(LispPTR tos)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  DLword *pDVar10;
  uint uVar11;
  uint uVar12;
  LispPTR *base;
  ulong uVar13;
  ulong uVar14;
  DLword *pDVar15;
  long lVar16;
  uint uVar17;
  int iVar19;
  undefined1 auVar18 [16];
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar31;
  int iVar36;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar37;
  int iVar39;
  undefined1 auVar38 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar42 [16];
  
  pDVar10 = DTDspace;
  if ((tos & 0xfff0000) == 0xe0000) {
    uVar17 = (tos & 0xffff) << 5;
    if (*(short *)((long)DTDspace + (ulong)(ushort)tos * 4 + (ulong)uVar17 + 4) != 0) {
      uVar13 = (ulong)((tos & 0xffff) + (tos & 0xffff));
      uVar11 = *(uint *)((long)DTDspace + uVar13 * 2 + (ulong)uVar17 + 8);
      pDVar15 = Lisp_world;
      while (uVar11 = uVar11 & 0xfffffff, Lisp_world = pDVar15, uVar11 == 0) {
        base = alloc_mdspage(*(short *)((long)pDVar10 + uVar13 * 2 + (ulong)uVar17 + 0x22));
        uVar11 = initmdspage(base,*(DLword *)((long)pDVar10 + uVar13 * 2 + (ulong)uVar17 + 4),0);
        *(uint *)((long)pDVar10 + uVar13 * 2 + (ulong)uVar17 + 8) = uVar11;
        pDVar15 = Lisp_world;
        if ((uVar11 >> 0x1b & 1) != 0) {
          error("bad entry on free chain.");
          uVar11 = *(uint *)((long)pDVar10 + uVar13 * 2 + (ulong)uVar17 + 8);
          pDVar15 = Lisp_world;
        }
      }
      uVar12 = *(uint *)(pDVar15 + uVar11);
      if (uVar12 == 0xe0001) {
        error("N_OP_createcell E0001 error");
        uVar12 = *(uint *)(pDVar15 + uVar11);
      }
      *(uint *)((long)pDVar10 + uVar13 * 2 + (ulong)uVar17 + 8) = uVar12 & 0xfffffff;
      if ((uVar12 & 0x8000001) != 0) {
        error("bad entry on free chain.");
      }
      piVar1 = (int *)((long)pDVar10 + uVar13 * 2 + (ulong)uVar17 + 0x18);
      *piVar1 = *piVar1 + 1;
      auVar9 = _DAT_00146770;
      auVar8 = _DAT_00146760;
      auVar7 = _DAT_00146750;
      auVar6 = _DAT_00146740;
      auVar5 = _DAT_00143d50;
      uVar13 = (ulong)*(ushort *)((long)pDVar10 + uVar13 * 2 + (ulong)uVar17 + 4);
      if (uVar13 != 0) {
        uVar13 = uVar13 + 0x7fffffffffffffff;
        uVar14 = uVar13 & 0x7fffffffffffffff;
        auVar18._8_4_ = (int)uVar14;
        auVar18._0_8_ = uVar14;
        auVar18._12_4_ = (int)(uVar14 >> 0x20);
        pDVar15 = pDVar15 + (ulong)uVar11 + 7;
        lVar16 = 0;
        auVar18 = auVar18 ^ _DAT_00143d50;
        do {
          auVar30._8_4_ = (int)lVar16;
          auVar30._0_8_ = lVar16;
          auVar30._12_4_ = (int)((ulong)lVar16 >> 0x20);
          auVar22 = (auVar30 | auVar9) ^ auVar5;
          iVar31 = auVar18._0_4_;
          iVar37 = -(uint)(iVar31 < auVar22._0_4_);
          iVar19 = auVar18._4_4_;
          auVar23._4_4_ = -(uint)(iVar19 < auVar22._4_4_);
          iVar36 = auVar18._8_4_;
          iVar39 = -(uint)(iVar36 < auVar22._8_4_);
          iVar20 = auVar18._12_4_;
          auVar23._12_4_ = -(uint)(iVar20 < auVar22._12_4_);
          auVar33._4_4_ = iVar37;
          auVar33._0_4_ = iVar37;
          auVar33._8_4_ = iVar39;
          auVar33._12_4_ = iVar39;
          auVar40 = pshuflw(in_XMM11,auVar33,0xe8);
          auVar25._4_4_ = -(uint)(auVar22._4_4_ == iVar19);
          auVar25._12_4_ = -(uint)(auVar22._12_4_ == iVar20);
          auVar25._0_4_ = auVar25._4_4_;
          auVar25._8_4_ = auVar25._12_4_;
          auVar42 = pshuflw(in_XMM12,auVar25,0xe8);
          auVar23._0_4_ = auVar23._4_4_;
          auVar23._8_4_ = auVar23._12_4_;
          auVar41 = pshuflw(auVar40,auVar23,0xe8);
          auVar22._8_4_ = 0xffffffff;
          auVar22._0_8_ = 0xffffffffffffffff;
          auVar22._12_4_ = 0xffffffff;
          auVar22 = (auVar41 | auVar42 & auVar40) ^ auVar22;
          auVar22 = packssdw(auVar22,auVar22);
          if ((auVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)((ulong)(pDVar15 + -7) ^ 2) = 0;
          }
          auVar23 = auVar25 & auVar33 | auVar23;
          auVar22 = packssdw(auVar23,auVar23);
          auVar41._8_4_ = 0xffffffff;
          auVar41._0_8_ = 0xffffffffffffffff;
          auVar41._12_4_ = 0xffffffff;
          auVar22 = packssdw(auVar22 ^ auVar41,auVar22 ^ auVar41);
          if ((auVar22._0_4_ >> 0x10 & 1) != 0) {
            *(undefined2 *)((ulong)(pDVar15 + -6) ^ 2) = 0;
          }
          auVar22 = (auVar30 | auVar8) ^ auVar5;
          iVar37 = -(uint)(iVar31 < auVar22._0_4_);
          auVar38._4_4_ = -(uint)(iVar19 < auVar22._4_4_);
          iVar39 = -(uint)(iVar36 < auVar22._8_4_);
          auVar38._12_4_ = -(uint)(iVar20 < auVar22._12_4_);
          auVar24._4_4_ = iVar37;
          auVar24._0_4_ = iVar37;
          auVar24._8_4_ = iVar39;
          auVar24._12_4_ = iVar39;
          auVar32._4_4_ = -(uint)(auVar22._4_4_ == iVar19);
          auVar32._12_4_ = -(uint)(auVar22._12_4_ == iVar20);
          auVar32._0_4_ = auVar32._4_4_;
          auVar32._8_4_ = auVar32._12_4_;
          auVar38._0_4_ = auVar38._4_4_;
          auVar38._8_4_ = auVar38._12_4_;
          auVar22 = auVar32 & auVar24 | auVar38;
          auVar22 = packssdw(auVar22,auVar22);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar22 = packssdw(auVar22 ^ auVar2,auVar22 ^ auVar2);
          if ((auVar22 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((ulong)(pDVar15 + -5) ^ 2) = 0;
          }
          auVar25 = pshufhw(auVar24,auVar24,0x84);
          auVar33 = pshufhw(auVar32,auVar32,0x84);
          auVar23 = pshufhw(auVar25,auVar38,0x84);
          auVar26._8_4_ = 0xffffffff;
          auVar26._0_8_ = 0xffffffffffffffff;
          auVar26._12_4_ = 0xffffffff;
          auVar26 = (auVar23 | auVar33 & auVar25) ^ auVar26;
          auVar25 = packssdw(auVar26,auVar26);
          if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((ulong)(pDVar15 + -4) ^ 2) = 0;
          }
          auVar25 = (auVar30 | auVar7) ^ auVar5;
          iVar37 = -(uint)(iVar31 < auVar25._0_4_);
          auVar28._4_4_ = -(uint)(iVar19 < auVar25._4_4_);
          iVar39 = -(uint)(iVar36 < auVar25._8_4_);
          auVar28._12_4_ = -(uint)(iVar20 < auVar25._12_4_);
          auVar34._4_4_ = iVar37;
          auVar34._0_4_ = iVar37;
          auVar34._8_4_ = iVar39;
          auVar34._12_4_ = iVar39;
          auVar22 = pshuflw(auVar22,auVar34,0xe8);
          auVar27._4_4_ = -(uint)(auVar25._4_4_ == iVar19);
          auVar27._12_4_ = -(uint)(auVar25._12_4_ == iVar20);
          auVar27._0_4_ = auVar27._4_4_;
          auVar27._8_4_ = auVar27._12_4_;
          auVar25 = pshuflw(auVar42 & auVar40,auVar27,0xe8);
          in_XMM12 = auVar25 & auVar22;
          auVar28._0_4_ = auVar28._4_4_;
          auVar28._8_4_ = auVar28._12_4_;
          auVar22 = pshuflw(auVar22,auVar28,0xe8);
          auVar40._8_4_ = 0xffffffff;
          auVar40._0_8_ = 0xffffffffffffffff;
          auVar40._12_4_ = 0xffffffff;
          auVar40 = (auVar22 | in_XMM12) ^ auVar40;
          in_XMM11 = packssdw(auVar40,auVar40);
          if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)((ulong)(pDVar15 + -3) ^ 2) = 0;
          }
          auVar28 = auVar27 & auVar34 | auVar28;
          auVar22 = packssdw(auVar28,auVar28);
          auVar42._8_4_ = 0xffffffff;
          auVar42._0_8_ = 0xffffffffffffffff;
          auVar42._12_4_ = 0xffffffff;
          auVar22 = packssdw(auVar22 ^ auVar42,auVar22 ^ auVar42);
          if ((auVar22 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(undefined2 *)((ulong)(pDVar15 + -2) ^ 2) = 0;
          }
          auVar22 = (auVar30 | auVar6) ^ auVar5;
          iVar31 = -(uint)(iVar31 < auVar22._0_4_);
          auVar35._4_4_ = -(uint)(iVar19 < auVar22._4_4_);
          iVar36 = -(uint)(iVar36 < auVar22._8_4_);
          auVar35._12_4_ = -(uint)(iVar20 < auVar22._12_4_);
          auVar29._4_4_ = iVar31;
          auVar29._0_4_ = iVar31;
          auVar29._8_4_ = iVar36;
          auVar29._12_4_ = iVar36;
          auVar21._4_4_ = -(uint)(auVar22._4_4_ == iVar19);
          auVar21._12_4_ = -(uint)(auVar22._12_4_ == iVar20);
          auVar21._0_4_ = auVar21._4_4_;
          auVar21._8_4_ = auVar21._12_4_;
          auVar35._0_4_ = auVar35._4_4_;
          auVar35._8_4_ = auVar35._12_4_;
          auVar22 = auVar21 & auVar29 | auVar35;
          auVar22 = packssdw(auVar22,auVar22);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar22 = packssdw(auVar22 ^ auVar3,auVar22 ^ auVar3);
          if ((auVar22 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((ulong)(pDVar15 + -1) ^ 2) = 0;
          }
          auVar30 = pshufhw(auVar29,auVar29,0x84);
          auVar22 = pshufhw(auVar21,auVar21,0x84);
          auVar25 = pshufhw(auVar30,auVar35,0x84);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar22 = packssdw(auVar22 & auVar30,(auVar25 | auVar22 & auVar30) ^ auVar4);
          if ((auVar22 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((ulong)pDVar15 ^ 2) = 0;
          }
          lVar16 = lVar16 + 8;
          pDVar15 = pDVar15 + 8;
        } while ((uVar14 - ((uint)uVar13 & 7)) + 8 != lVar16);
      }
      if (*(short *)((ulong)(uVar11 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) < 0) {
        return uVar11;
      }
      if (*GcDisabled_word == 0x4c) {
        return uVar11;
      }
      if (*Reclaim_cnt_word != 0) {
        htfind(uVar11,1);
        return uVar11;
      }
      rec_htfind(uVar11,1);
      return uVar11;
    }
  }
  MachineState.errorexit = 1;
  MachineState.tosvalue = tos;
  return 0xffffffff;
}

Assistant:

LispPTR N_OP_createcell(LispPTR tos) {
  struct dtd *dtd68k;
  DLword *ptr, *lastptr;
  LispPTR newcell;
  unsigned int type;

  if ((tos & SEGMASK) != S_POSITIVE) ERROR_EXIT(tos);
  type = tos & 0xffff;

#ifdef DTDDEBUG
  if (type == TYPE_LISTP) error("N_OP_createcell : Can't create Listp cell with CREATECELL");
  check_dtd_chain(type);
#endif

  dtd68k = (struct dtd *)GetDTD(type);

  oldoldfree = oldfree;
  oldfree = dtd68k->dtd_free;

  if (dtd68k->dtd_size == 0) ERROR_EXIT(tos);
/* error("OP_createcell : Attempt to create a cell not declared yet"); */

retry:
  if ((tos = newcell = ((dtd68k->dtd_free) & POINTERMASK)) != NIL) {
    ptr = (DLword *)NativeAligned2FromLAddr(newcell);
    if (917505 == *(LispPTR *)ptr) error("N_OP_createcell E0001 error");
    /* replace dtd_free with newcell's top DLword (it may keep next chain)*/
    dtd68k->dtd_free = (*((LispPTR *)ptr)) & POINTERMASK;
    if (dtd68k->dtd_free & 0x8000001) error("bad entry on free chain.");

    dtd68k->dtd_oldcnt++;

    /* clear 0  */
    for (lastptr = ptr + dtd68k->dtd_size; ptr != lastptr; ptr++) { GETWORD(ptr) = 0; }

    /*	 IncAllocCnt(1); */
    GCLOOKUP(tos, DELREF);
    return (tos);
  } else {
    dtd68k->dtd_free = initmdspage(alloc_mdspage(dtd68k->dtd_typeentry), dtd68k->dtd_size, NIL);
    if (dtd68k->dtd_free & 0x8000000) error("bad entry on free chain.");
    goto retry;
  }

}